

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_robertson_root.c
# Opt level: O1

int main(void)

{
  undefined8 *puVar1;
  uint uVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  long lVar6;
  FILE *__s;
  char *pcVar7;
  int iVar8;
  double dVar9;
  void *arkode_mem;
  SUNContext ctx;
  sunrealtype t;
  int rootsfound [2];
  long nge;
  long netf;
  long ncfn;
  long nnf;
  long nni;
  long nfeLS;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  long local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  uint local_b8;
  uint local_b4;
  long local_b0;
  long local_a8;
  long *local_a0;
  double local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_d0 = 0;
  uVar2 = SUNContext_Create(0,&local_c8);
  if ((int)uVar2 < 0) {
    pcVar7 = "SUNContext_Create";
  }
  else {
    puts("\nRobertson ODE test problem (with rootfinding):");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",0x3ff0000000000000,0,0);
    plVar3 = (long *)N_VNew_Serial(3,local_c8);
    if (plVar3 == (long *)0x0) {
      main_cold_5();
      return 1;
    }
    puVar1 = *(undefined8 **)(*plVar3 + 0x10);
    *puVar1 = 0x3ff0000000000000;
    puVar1[1] = 0;
    puVar1[2] = 0;
    plVar4 = (long *)N_VClone(plVar3);
    if (plVar4 == (long *)0x0) {
      main_cold_4();
      return 1;
    }
    puVar1 = *(undefined8 **)(*plVar4 + 0x10);
    *puVar1 = 0x3e45798ee2308c3a;
    puVar1[1] = 0x3da5fd7fe1796495;
    puVar1[2] = 0x3e45798ee2308c3a;
    local_d0 = ARKStepCreate(0,0,f,plVar3,local_c8);
    if (local_d0 == 0) {
      main_cold_3();
      return 1;
    }
    uVar2 = ARKodeSetMaxErrTestFails(local_d0,0x14);
    if ((int)uVar2 < 0) {
      pcVar7 = "ARKodeSetMaxErrTestFails";
    }
    else {
      uVar2 = ARKodeSetMaxNonlinIters(local_d0,8);
      if ((int)uVar2 < 0) {
        pcVar7 = "ARKodeSetMaxNonlinIters";
      }
      else {
        uVar2 = ARKodeSetNonlinConvCoef(0x3e7ad7f29abcaf48,local_d0);
        if ((int)uVar2 < 0) {
          pcVar7 = "ARKodeSetNonlinConvCoef";
        }
        else {
          uVar2 = ARKodeSetMaxNumSteps(local_d0,100000);
          if (-1 < (int)uVar2) {
            uVar2 = ARKodeSetPredictorMethod(local_d0,1);
            if ((int)uVar2 < 0) {
              pcVar7 = "ARKodeSetPredictorMethod";
            }
            else {
              uVar2 = ARKodeSVtolerances(0x3f1a36e2eb1c432d,local_d0,plVar4);
              if ((int)uVar2 < 0) {
                pcVar7 = "ARKodeSStolerances";
              }
              else {
                uVar2 = ARKodeRootInit(local_d0,2,g);
                if ((int)uVar2 < 0) {
                  pcVar7 = "ARKodeRootInit";
                }
                else {
                  lVar5 = SUNDenseMatrix(3,3,local_c8);
                  if (lVar5 == 0) {
                    main_cold_2();
                    return 1;
                  }
                  lVar6 = SUNLinSol_Dense(plVar3,lVar5,local_c8);
                  if (lVar6 == 0) {
                    main_cold_1();
                    return 1;
                  }
                  uVar2 = ARKodeSetLinearSolver(local_d0,lVar6,lVar5);
                  if ((int)uVar2 < 0) {
                    pcVar7 = "ARKodeSetLinearSolver";
                  }
                  else {
                    uVar2 = ARKodeSetJacFn(local_d0,Jac);
                    if (-1 < (int)uVar2) {
                      local_b0 = lVar6;
                      local_a8 = lVar5;
                      local_a0 = plVar4;
                      __s = fopen("solution.txt","w");
                      fwrite("# t u v w\n",10,1,__s);
                      puVar1 = *(undefined8 **)(*plVar3 + 0x10);
                      fprintf(__s," %.16e %.16e %.16e %.16e\n",0,*puVar1,puVar1[1],puVar1[2]);
                      local_c0 = 0;
                      puts("        t             u             v             w");
                      puts("   -----------------------------------------------------");
                      puVar1 = *(undefined8 **)(*plVar3 + 0x10);
                      printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",local_c0,*puVar1,puVar1[1],
                             puVar1[2]);
                      dVar9 = 0.4;
                      iVar8 = 0xc;
                      do {
                        local_98 = dVar9;
                        uVar2 = ARKodeEvolve(local_d0,plVar3,&local_c0,1);
                        if ((int)uVar2 < 0) {
                          fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                  "ARKodeEvolve",(ulong)uVar2);
                          break;
                        }
                        puVar1 = *(undefined8 **)(*plVar3 + 0x10);
                        printf("  %12.5e  %12.5e  %12.5e  %12.5e\n",local_c0,*puVar1,puVar1[1],
                               puVar1[2]);
                        puVar1 = *(undefined8 **)(*plVar3 + 0x10);
                        fprintf(__s," %.16e %.16e %.16e %.16e\n",local_c0,*puVar1,puVar1[1],
                                puVar1[2]);
                        if (uVar2 == 2) {
                          uVar2 = ARKodeGetRootInfo(local_d0,&local_b8);
                          if ((int)uVar2 < 0) {
                            pcVar7 = "ARKodeGetRootInfo";
                            goto LAB_00102dc3;
                          }
                          printf("      rootsfound[] = %3d %3d\n",(ulong)local_b8,(ulong)local_b4);
                        }
                        dVar9 = local_98 * 10.0;
                        iVar8 = iVar8 + -1;
                      } while (iVar8 != 0);
                      puts("   -----------------------------------------------------");
                      fclose(__s);
                      uVar2 = ARKodeGetNumSteps(local_d0,&local_38);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumSteps",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumStepAttempts(local_d0,&local_40);
                      plVar4 = local_a0;
                      lVar6 = local_a8;
                      lVar5 = local_b0;
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumStepAttempts",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumRhsEvals(local_d0,0,&local_48);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumRhsEvals",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumRhsEvals(local_d0,1,&local_50);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumRhsEvals",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumLinSolvSetups(local_d0,&local_58);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumLinSolvSetups",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumErrTestFails(local_d0,&local_88);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumErrTestFails",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumStepSolveFails(local_d0,&local_80);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumStepSolveFails",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumNonlinSolvIters(local_d0,&local_70);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumNonlinSolvIters",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumNonlinSolvConvFails(local_d0,&local_78);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumNonlinSolvConvFails",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumJacEvals(local_d0,&local_60);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumJacEvals",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumLinRhsEvals(local_d0,&local_68);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumLinRhsEvals",(ulong)uVar2);
                      }
                      uVar2 = ARKodeGetNumGEvals(local_d0,&local_90);
                      if ((int)uVar2 < 0) {
                        fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",
                                "ARKodeGetNumGEvals",(ulong)uVar2);
                      }
                      puts("\nFinal Solver Statistics:");
                      printf("   Internal solver steps = %li (attempted = %li)\n",local_38,local_40)
                      ;
                      printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",local_48,local_50);
                      printf("   Total linear solver setups = %li\n",local_58);
                      printf("   Total RHS evals for setting up the linear system = %li\n",local_68)
                      ;
                      printf("   Total number of Jacobian evaluations = %li\n",local_60);
                      printf("   Total number of Newton iterations = %li\n",local_70);
                      printf("   Total root-function g evals = %li\n",local_90);
                      printf("   Total number of nonlinear solver convergence failures = %li\n",
                             local_78);
                      printf("   Total number of error test failures = %li\n",local_88);
                      printf("   Total number of failed steps from solver failure = %li\n",local_80)
                      ;
                      N_VDestroy(plVar3);
                      N_VDestroy(plVar4);
                      ARKodeFree(&local_d0);
                      SUNLinSolFree(lVar5);
                      SUNMatDestroy(lVar6);
                      SUNContext_Free(&local_c8);
                      return 0;
                    }
                    pcVar7 = "ARKodeSetJacFn";
                  }
                }
              }
            }
            fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar7,(ulong)uVar2);
            return 1;
          }
          pcVar7 = "ARKodeSetMaxNumSteps";
        }
      }
    }
  }
LAB_00102dc3:
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with flag = %d\n\n",pcVar7,(ulong)uVar2);
  return 1;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);  /* initial time */
  sunrealtype T1    = SUN_RCONST(0.4);  /* first output time */
  sunrealtype TMult = SUN_RCONST(10.0); /* output time multiplication factor */
  int Nt            = 12;               /* total number of output times */
  sunindextype NEQ  = 3;                /* number of dependent vars. */

  /* rootfinding variables */
  int rootsfound[2];
  int rtflag; /* root info flag */

  /* general problem variables */
  int flag;                  /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  N_Vector atols     = NULL; /* empty vector for absolute tolerances */
  SUNMatrix A        = NULL; /* empty matrix for linear solver */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKode memory structure */
  FILE* UFID;
  sunrealtype t, tout;
  int iout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, nnf, ncfn, netf, nge;

  /* set up the initial conditions */
  sunrealtype u0     = SUN_RCONST(1.0);
  sunrealtype v0     = SUN_RCONST(0.0);
  sunrealtype w0     = SUN_RCONST(0.0);
  sunrealtype reltol = SUN_RCONST(1.0e-4);

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  flag = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_flag(&flag, "SUNContext_Create", 1)) { return 1; }

  /* Initial problem output */
  printf("\nRobertson ODE test problem (with rootfinding):\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_flag((void*)y, "N_VNew_Serial", 0)) { return 1; }
  NV_Ith_S(y, 0) = u0; /* Set initial conditions into y */
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  atols = N_VClone(y); /* Create serial vector absolute tolerances */
  if (check_flag((void*)atols, "N_VNew_Serial", 0)) { return 1; }

  /* Set absolute tolerances */
  NV_Ith_S(atols, 0) = SUN_RCONST(1.0e-8);
  NV_Ith_S(atols, 1) = SUN_RCONST(1.0e-11);
  NV_Ith_S(atols, 2) = SUN_RCONST(1.0e-8);

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the initial time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_flag((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  flag = ARKodeSetMaxErrTestFails(arkode_mem,
                                  20); /* Increase max error test fails */
  if (check_flag(&flag, "ARKodeSetMaxErrTestFails", 1)) { return 1; }
  flag = ARKodeSetMaxNonlinIters(arkode_mem, 8); /* Increase max nonlin iters  */
  if (check_flag(&flag, "ARKodeSetMaxNonlinIters", 1)) { return 1; }
  flag = ARKodeSetNonlinConvCoef(arkode_mem,
                                 SUN_RCONST(1.e-7)); /* Set nonlinear convergence coeff. */
  if (check_flag(&flag, "ARKodeSetNonlinConvCoef", 1)) { return 1; }
  flag = ARKodeSetMaxNumSteps(arkode_mem, 100000); /* Increase max num steps */
  if (check_flag(&flag, "ARKodeSetMaxNumSteps", 1)) { return 1; }
  flag = ARKodeSetPredictorMethod(arkode_mem,
                                  1); /* Specify maximum-order predictor */
  if (check_flag(&flag, "ARKodeSetPredictorMethod", 1)) { return 1; }
  flag = ARKodeSVtolerances(arkode_mem, reltol, atols); /* Specify tolerances */
  if (check_flag(&flag, "ARKodeSStolerances", 1)) { return 1; }

  /* Specify the root-finding function, having 2 equations */
  flag = ARKodeRootInit(arkode_mem, 2, g);
  if (check_flag(&flag, "ARKodeRootInit", 1)) { return 1; }

  /* Initialize dense matrix data structure and solver */
  A = SUNDenseMatrix(NEQ, NEQ, ctx);
  if (check_flag((void*)A, "SUNDenseMatrix", 0)) { return 1; }
  LS = SUNLinSol_Dense(y, A, ctx);
  if (check_flag((void*)LS, "SUNLinSol_Dense", 0)) { return 1; }

  /* Linear solver interface */
  flag = ARKodeSetLinearSolver(arkode_mem, LS,
                               A); /* Attach matrix and linear solver */
  if (check_flag(&flag, "ARKodeSetLinearSolver", 1)) { return 1; }
  flag = ARKodeSetJacFn(arkode_mem, Jac); /* Set the Jacobian routine */
  if (check_flag(&flag, "ARKodeSetJacFn", 1)) { return 1; }

  /* Open output stream for results, output comment line */
  UFID = fopen("solution.txt", "w");
  fprintf(UFID, "# t u v w\n");

  /* output initial condition to disk */
  fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", T0,
          NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached */
  t = T0;
  printf("        t             u             v             w\n");
  printf("   -----------------------------------------------------\n");
  printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "\n", t,
         NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
  tout = T1;
  iout = 0;
  while (1)
  {
    flag = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_flag(&flag, "ARKodeEvolve", 1)) { break; }
    printf("  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM "  %12.5" ESYM
           "\n", /* access/print solution */
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    fprintf(UFID, " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n", t,
            NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    if (flag == ARK_ROOT_RETURN)
    { /* check if a root was found */
      rtflag = ARKodeGetRootInfo(arkode_mem, rootsfound);
      if (check_flag(&rtflag, "ARKodeGetRootInfo", 1)) { return 1; }
      printf("      rootsfound[] = %3d %3d\n", rootsfound[0], rootsfound[1]);
    }
    if (flag >= 0)
    { /* successful solve: update output time */
      iout++;
      tout *= TMult;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
    if (iout == Nt) { break; /* stop after enough outputs */ }
  }
  printf("   -----------------------------------------------------\n");
  fclose(UFID);

  /* Print some final statistics */
  flag = ARKodeGetNumSteps(arkode_mem, &nst);
  check_flag(&flag, "ARKodeGetNumSteps", 1);
  flag = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_flag(&flag, "ARKodeGetNumStepAttempts", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfe);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumRhsEvals(arkode_mem, 1, &nfi);
  check_flag(&flag, "ARKodeGetNumRhsEvals", 1);
  flag = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_flag(&flag, "ARKodeGetNumLinSolvSetups", 1);
  flag = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_flag(&flag, "ARKodeGetNumErrTestFails", 1);
  flag = ARKodeGetNumStepSolveFails(arkode_mem, &ncfn);
  check_flag(&flag, "ARKodeGetNumStepSolveFails", 1);
  flag = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_flag(&flag, "ARKodeGetNumNonlinSolvIters", 1);
  flag = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &nnf);
  check_flag(&flag, "ARKodeGetNumNonlinSolvConvFails", 1);
  flag = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_flag(&flag, "ARKodeGetNumJacEvals", 1);
  flag = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_flag(&flag, "ARKodeGetNumLinRhsEvals", 1);
  flag = ARKodeGetNumGEvals(arkode_mem, &nge);
  check_flag(&flag, "ARKodeGetNumGEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total root-function g evals = %li\n", nge);
  printf("   Total number of nonlinear solver convergence failures = %li\n", nnf);
  printf("   Total number of error test failures = %li\n", netf);
  printf("   Total number of failed steps from solver failure = %li\n", ncfn);

  /* Clean up and return with successful completion */
  N_VDestroy(y);           /* Free y vector */
  N_VDestroy(atols);       /* Free atols vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNMatDestroy(A);        /* Free A matrix */
  SUNContext_Free(&ctx);   /* Free context */

  return 0;
}